

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.h
# Opt level: O2

void __thiscall kws::Parser::SetBuffer(Parser *this,string *buffer)

{
  string *buffer_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar1;
  char *pcVar2;
  size_t currentPosition;
  unsigned_long local_40;
  string local_38;
  
  buffer_00 = &this->m_Buffer;
  std::__cxx11::string::_M_assign((string *)buffer_00);
  ConvertBufferToWindowsFileType(this,buffer_00);
  std::__cxx11::string::_M_assign((string *)&this->m_FixedBuffer);
  RemoveComments_abi_cxx11_(&local_38,this,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = &this->m_Positions;
  puVar1 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_40 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (this_00,&local_40);
  pcVar2 = (buffer_00->_M_dataplus)._M_p;
  local_40 = 0;
  do {
    if (*pcVar2 == '\n') {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&local_40);
    }
    else if (*pcVar2 == '\0') {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&local_40);
      return;
    }
    local_40 = local_40 + 1;
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void SetBuffer(std::string buffer) 
    {
    m_Buffer = buffer;
    this->ConvertBufferToWindowsFileType(m_Buffer);
    m_FixedBuffer = m_Buffer;
    this->RemoveComments();

    //Fill up the m_positions vector
    m_Positions.clear();
    m_Positions.push_back(0);
    const char* currentCharacter = m_Buffer.c_str();
    size_t currentPosition = 0;
    while( *currentCharacter )
      {
      if( (*currentCharacter) == '\n' )
        m_Positions.push_back(currentPosition);
      currentPosition++;
      currentCharacter++;
      }
    m_Positions.push_back(currentPosition);
    }